

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O2

void __thiscall
TLeonardoHeap<smoothsort_ptr<double>_>::filter
          (TLeonardoHeap<smoothsort_ptr<double>_> *this,size_t element,size_t order,
          bool test_children)

{
  return;
}

Assistant:

inline void TLeonardoHeap<T>::filter(size_t element, size_t order, bool test_children) {
	size_t current = element;
	size_t order_current = order;
	size_t size_current;
	size_t bitvector_mask = 2;
	while(true) {
		// Check that there is a tree to the left
		size_current = Leonardo_k[order_current];
		if(size_current > current) { break; }
		
		// Determine whether root needs to be swapped with next tree to the left
		if(!(data[current-size_current] > data[current])) {
			break;
		} else if((size_current == 1) || !test_children) {	// Root of next tree greater than root of current tree
			swap(current, current-size_current);	// Singleton node, or current tree is already heapified
		} else {	// Current tree not singleton node and child nodes must be compared
			// Root of next tree greater than both children of root of current tree
			if((data[current-size_current] > data[current-1]) && (data[current-size_current] > data[current-1-Leonardo_k[order_current-2]])) {
				swap(current, current-size_current);
			} else {
				break;
			}
		}
		
		// Find the order of the next tree to the left
		order_current++;
		for(; order_current<N+1; order_current++, bitvector_mask<<=1) { // For is used just for the purposes of safety. A while loop would work too.
			if(tree_vector & bitvector_mask) { bitvector_mask <<= 1; break; }
		}
		// Shift the position marker leftwards
		current -= size_current;
	}
	heapify(current, order_current);
}